

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::find_array(void)

{
  bool bVar1;
  size_type in_RCX;
  char *pcVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  int *other;
  double *other_00;
  char (*other_01) [6];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_a68;
  basic_variable<std::allocator<char>_> *local_9d8;
  iterator local_9d0;
  basic_variable<std::allocator<char>_> local_9b8;
  undefined1 local_980 [8];
  iterator where_20;
  basic_variable<std::allocator<char>_> local_948;
  undefined1 local_918 [64];
  undefined1 local_8d8 [8];
  iterator where_19;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 local_878 [8];
  iterator where_18;
  undefined1 local_848 [8];
  iterator where_17;
  iterator local_828;
  iterator local_810;
  difference_type local_7f8 [2];
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7b8 [8];
  iterator where_16;
  iterator local_798;
  iterator local_780;
  difference_type local_768 [2];
  undefined1 local_758 [8];
  iterator where_15;
  basic_variable<std::allocator<char>_> local_728;
  undefined1 local_6f0 [8];
  iterator where_14;
  undefined1 local_6c0 [16];
  iterator where_13;
  iterator local_698;
  iterator local_680;
  difference_type local_668 [2];
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_620 [8];
  iterator where_12;
  iterator local_600;
  iterator local_5e8;
  difference_type local_5d0 [2];
  undefined1 local_5c0 [16];
  iterator where_11;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_550 [8];
  iterator where_10;
  undefined1 local_51c [12];
  iterator where_9;
  iterator local_4f8;
  iterator local_4e0;
  difference_type local_4c8 [2];
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 local_488 [8];
  iterator where_8;
  iterator local_468;
  iterator local_450;
  difference_type local_438;
  undefined1 local_42c [12];
  iterator where_7;
  basic_variable<std::allocator<char>_> local_3f8;
  undefined1 local_3c0 [8];
  iterator where_6;
  undefined1 local_389 [9];
  iterator where_5;
  iterator local_368;
  iterator local_350;
  difference_type local_338 [2];
  basic_variable<std::allocator<char>_> local_328;
  undefined1 local_2f8 [8];
  iterator where_4;
  iterator local_2d8;
  iterator local_2c0;
  difference_type local_2a8;
  undefined1 local_299 [9];
  iterator where_3;
  iterator local_278;
  iterator local_260;
  difference_type local_248 [2];
  basic_variable<std::allocator<char>_> local_238;
  undefined1 local_200 [8];
  iterator where_2;
  iterator local_1e0;
  iterator local_1c8;
  difference_type local_1b0;
  undefined1 local_1a4 [12];
  iterator where_1;
  undefined1 local_170 [8];
  iterator where;
  nullable local_144;
  basic_variable<std::allocator<char>_> *local_140;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_140 = &local_138;
  local_144 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,&local_144);
  local_140 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_140,true);
  local_140 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_140,2);
  local_140 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_140,3.0);
  local_140 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_140,"hydrogen");
  local_48._0_8_ = &local_138;
  local_48._8_8_ = 5;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x5;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_9d8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_9d8 = local_9d8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_9d8);
  } while (local_9d8 != &local_138);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_170,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_38,&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_170,
                     (iterator *)
                     &where_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x74f,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_170);
  local_1a4._0_4_ = 0;
  trial::dynamic::value::find<std::allocator<char>,trial::dynamic::nullable>
            ((iterator *)(local_1a4 + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_1a4,(nullable *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_1e0,(iterator *)(local_1a4 + 4));
  local_1b0 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_1c8,&local_1e0);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x754;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x754,"void value_find_suite::find_array()",&local_1b0,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_1a4 + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_238);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_200,(value *)local_38,&local_238,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_278,(iterator *)local_200);
  local_248[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_260,&local_278);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar4 = (bool *)0x758;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x758,"void value_find_suite::find_array()",local_248,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_200);
  local_299[0] = '\x01';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_299 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_299,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_2c0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_2d8,(iterator *)(local_299 + 1));
  local_2a8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_2c0,&local_2d8);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x75d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x75d,"void value_find_suite::find_array()",&local_2a8,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_2c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_299 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_328,true);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_2f8,(value *)local_38,&local_328,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_350,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_368,(iterator *)local_2f8);
  local_338[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_350,&local_368);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar4 = (bool *)0x761;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x761,"void value_find_suite::find_array()",local_338,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_368);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_350);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_2f8);
  local_389[0] = '\0';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_389 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_389,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_389 + 1),
                     (iterator *)
                     &where_6.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x765,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_389 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_3f8,false);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_3c0,(value *)local_38,&local_3f8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_3c0,
                     (iterator *)
                     &where_7.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x769,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3c0);
  local_42c._0_4_ = 2;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_42c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_42c,(int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_450,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_468,(iterator *)(local_42c + 4));
  local_438 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_450,&local_468);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x76e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x76e,"void value_find_suite::find_array()",&local_438,
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_42c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_4b8,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_488,(value *)local_38,&local_4b8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_4f8,(iterator *)local_488);
  local_4c8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_4e0,&local_4f8);
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  other = (int *)0x772;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x772,"void value_find_suite::find_array()",local_4c8,
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_488);
  local_51c._0_4_ = 0x16;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_51c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_51c,other);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_51c + 4),
                     (iterator *)
                     &where_10.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x776,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_51c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_588,0x16);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_550,(value *)local_38,&local_588,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_550,
                     (iterator *)
                     &where_11.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x77a,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_550);
  local_5c0._0_8_ = 0x4008000000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_5c0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_5c0,(double *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_600,(iterator *)(local_5c0 + 8));
  local_5d0[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_5e8,&local_600);
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x77f;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x77f,"void value_find_suite::find_array()",local_5d0,
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_600);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_5c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_658,3.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_620,(value *)local_38,&local_658,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_680,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_698,(iterator *)local_620);
  local_668[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_680,&local_698);
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  other_00 = (double *)0x783;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x783,"void value_find_suite::find_array()",local_668,
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_680);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_620);
  local_6c0._0_8_ = 0x4040800000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_6c0 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_6c0,other_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_6c0 + 8),
                     (iterator *)
                     &where_14.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x787,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_6c0 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_728,33.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_6f0,(value *)local_38,&local_728,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_6f0,
                     (iterator *)
                     &where_15.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x78b,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_6f0);
  trial::dynamic::value::find<std::allocator<char>,char[9]>
            ((iterator *)local_758,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"hydrogen",(char (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_780,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_798,(iterator *)local_758);
  local_768[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_780,&local_798);
  where_16.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0x790;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x790,"void value_find_suite::find_array()",local_768,
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_780);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7e8,"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_7b8,(value *)local_38,&local_7e8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_810,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_828,(iterator *)local_7b8);
  local_7f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_810,&local_828);
  where_17.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  other_01 = (char (*) [6])0x794;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x794,"void value_find_suite::find_array()",local_7f8,
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_810);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7b8);
  trial::dynamic::value::find<std::allocator<char>,char[6]>
            ((iterator *)local_848,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"alpha",other_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_848,
                     (iterator *)
                     &where_18.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x798,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8a8,"alpha");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_878,(value *)local_38,&local_8a8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_878,
                     (iterator *)
                     &where_19.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x79c,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_878);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_948,"hydrogen");
  local_918._0_8_ = &local_948;
  local_918._8_8_ = 1;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_918 + 0x10),
             (basic_array<std::allocator<char>_> *)local_918._0_8_,init_00);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_8d8,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_918 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_918 + 0x10));
  local_a68 = (basic_variable<std::allocator<char>_> *)local_918;
  do {
    local_a68 = local_a68 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_a68);
  } while (local_a68 != &local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_8d8,
                     (iterator *)
                     &where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_array()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x7a1,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8d8);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_9b8,(basic_map<std::allocator<char>> *)"alpha","hydrogen",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_980,(value *)local_38,&local_9b8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_9d0,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_980,&local_9d0);
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0x7a6,"void value_find_suite::find_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_980);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void find_array()
{
    variable data = array::make({ null, true, 2, 3.0, "hydrogen" });
    {
        variable::iterator where = value::find(data, data);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - null
    {
        variable::iterator where = value::find(data, null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable::iterator where = value::find(data, variable());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // array - boolean
    {
        variable::iterator where = value::find(data, true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, variable(true));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, false);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(false));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - integer
    {
        variable::iterator where = value::find(data, 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, variable(2));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, 22);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(22));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - real
    {
        variable::iterator where = value::find(data, 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, variable(3.0));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, 33.0);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(33.0));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - string
    {
        variable::iterator where = value::find(data, "hydrogen");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, variable("hydrogen"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, "alpha");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable("alpha"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - array
    {
        variable::iterator where = value::find(data, array::make({"hydrogen"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // array - map
    {
        variable::iterator where = value::find(data, map::make("alpha", "hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
}